

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream.h
# Opt level: O2

void __thiscall
embree::CommandLineStream::CommandLineStream
          (CommandLineStream *this,int argc,char **argv,string *name)

{
  char cVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__p;
  ulong uVar2;
  long lVar3;
  allocator local_59;
  CommandLineStream *local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  Stream<int>::Stream(&this->super_Stream<int>);
  (this->super_Stream<int>).super_RefCount._vptr_RefCount =
       (_func_int **)&PTR__CommandLineStream_002a8f10;
  this->i = 0;
  this->j = 0;
  (this->args).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->args).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->args).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->charNumber = 0;
  __p = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)::operator_new(0x20);
  std::__cxx11::string::string((string *)__p,(string *)name);
  std::__shared_ptr<std::__cxx11::string,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<std::__cxx11::string,void>
            ((__shared_ptr<std::__cxx11::string,(__gnu_cxx::_Lock_policy)2> *)&this->name,__p);
  if (0 < argc) {
    uVar2 = 0;
    do {
      cVar1 = (*argv)[uVar2];
      this->charNumber = this->charNumber + 1;
      if (0x3ff < uVar2) break;
      uVar2 = uVar2 + 1;
    } while (cVar1 != '\0');
  }
  local_58 = this;
  for (lVar3 = 1; lVar3 < argc; lVar3 = lVar3 + 1) {
    std::__cxx11::string::string((string *)&local_50,argv[lVar3],&local_59);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&this->args,
               &local_50);
    std::__cxx11::string::~string((string *)&local_50);
  }
  return;
}

Assistant:

CommandLineStream (int argc, char** argv, const std::string& name = "command line")
      : i(0), j(0), charNumber(0), name(std::shared_ptr<std::string>(new std::string(name)))
    {
      if (argc > 0) {
	for (size_t i=0; argv[0][i] && i<1024; i++) charNumber++;
	charNumber++;
      }
      for (ssize_t k=1; k<argc; k++) args.push_back(argv[k]);
    }